

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O0

void __thiscall xe::xml::Tokenizer::feed(Tokenizer *this,deUint8 *bytes,int numBytes)

{
  int iVar1;
  int iVar2;
  int numBytes_local;
  deUint8 *bytes_local;
  Tokenizer *this_local;
  
  iVar1 = de::RingBuffer<unsigned_char>::getNumFree(&this->m_buf);
  if (iVar1 < numBytes) {
    iVar1 = de::RingBuffer<unsigned_char>::getSize(&this->m_buf);
    iVar2 = de::RingBuffer<unsigned_char>::getNumElements(&this->m_buf);
    iVar1 = getNextBufferSize(iVar1,iVar2 + numBytes);
    de::RingBuffer<unsigned_char>::resize(&this->m_buf,iVar1);
  }
  de::RingBuffer<unsigned_char>::pushFront(&this->m_buf,bytes,numBytes);
  if (this->m_curToken == TOKEN_INCOMPLETE) {
    advance(this);
  }
  return;
}

Assistant:

void Tokenizer::feed (const deUint8* bytes, int numBytes)
{
	// Grow buffer if necessary.
	if (m_buf.getNumFree() < numBytes)
	{
		m_buf.resize(getNextBufferSize(m_buf.getSize(), m_buf.getNumElements()+numBytes));
	}

	// Append to front.
	m_buf.pushFront(bytes, numBytes);

	// If we haven't parsed complete token, re-try after data feed.
	if (m_curToken == TOKEN_INCOMPLETE)
		advance();
}